

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonschema::
compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
compilation_context(compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *this,uri_wrapper *retrieval_uri,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *custom_messages)

{
  initializer_list<jsoncons::jsonschema::uri_wrapper> __l;
  long in_RDI;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe98;
  uri_wrapper *in_stack_fffffffffffffea0;
  uri_wrapper *in_stack_fffffffffffffeb8;
  uri_wrapper *in_stack_fffffffffffffec0;
  allocator_type *in_stack_fffffffffffffec8;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  *in_stack_fffffffffffffed0;
  undefined8 **ppuVar1;
  iterator in_stack_fffffffffffffed8;
  undefined8 **ppuVar2;
  size_type in_stack_fffffffffffffee0;
  undefined1 *local_e0 [23];
  undefined8 *local_28;
  undefined8 local_20;
  
  uri_wrapper::uri_wrapper(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  uri_wrapper::uri_wrapper(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_28 = local_e0;
  local_20 = 1;
  std::allocator<jsoncons::jsonschema::uri_wrapper>::allocator
            ((allocator<jsoncons::jsonschema::uri_wrapper> *)0x82149b);
  __l._M_len = in_stack_fffffffffffffee0;
  __l._M_array = in_stack_fffffffffffffed8;
  std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  ::vector(in_stack_fffffffffffffed0,__l,in_stack_fffffffffffffec8);
  std::allocator<jsoncons::jsonschema::uri_wrapper>::~allocator
            ((allocator<jsoncons::jsonschema::uri_wrapper> *)0x8214c6);
  ppuVar2 = (undefined8 **)local_e0;
  ppuVar1 = &local_28;
  do {
    ppuVar1 = ppuVar1 + -0x17;
    uri_wrapper::~uri_wrapper(in_stack_fffffffffffffea0);
  } while (ppuVar1 != ppuVar2);
  std::optional<jsoncons::uri>::optional((optional<jsoncons::uri> *)0x82151e);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::__cxx11::string::string((string *)(in_RDI + 0x1a0));
  return;
}

Assistant:

explicit compilation_context(const uri_wrapper& retrieval_uri,
            const std::unordered_map<std::string,std::string>& custom_messages = std::unordered_map<std::string,std::string>{})
            : base_uri_(retrieval_uri), 
              uris_(std::vector<uri_wrapper>{{retrieval_uri}}),
              custom_messages_{custom_messages}
        {
        }